

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JsonReporter::testCaseStarting(JsonReporter *this,TestCaseInfo *tcInfo)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  TestCaseInfo *in_RSI;
  StreamingReporterBase *in_RDI;
  StringRef SVar1;
  StringRef SVar2;
  JsonObjectWriter testInfo;
  JsonValueWriter *in_stack_fffffffffffff8c8;
  JsonValueWriter *this_00;
  undefined1 in_stack_fffffffffffff8e8 [16];
  JsonReporter *local_708;
  TestCaseInfo *in_stack_fffffffffffff908;
  JsonArrayWriter *in_stack_fffffffffffff910;
  JsonReporter *in_stack_fffffffffffffab0;
  JsonObjectWriter local_538 [18];
  StringRef local_388;
  JsonObjectWriter local_378 [15];
  SourceLineInfo *in_stack_fffffffffffffdf8;
  JsonObjectWriter *in_stack_fffffffffffffe00;
  char *local_1d0;
  size_t local_1c8;
  JsonValueWriter local_1c0;
  undefined1 local_28 [40];
  
  StreamingReporterBase::testCaseStarting(in_RDI,in_RSI);
  startObject(local_708);
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
          ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                 *)0x1a403c);
  SVar1 = operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffff8c8);
  local_1d0 = SVar1.m_start;
  local_1c8 = SVar1.m_size;
  this_00 = &local_1c0;
  JsonObjectWriter::write((JsonObjectWriter *)this_00,(int)value,local_1d0,local_1c8);
  JsonValueWriter::writeObject(in_stack_fffffffffffff8c8);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a40aa);
  local_388 = operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffff8c8);
  JsonObjectWriter::write(local_378,(int)local_28,local_388.m_start,local_388.m_size);
  JsonValueWriter::write<std::__cxx11::string>(this_00,value);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a4116);
  anon_unknown_26::writeSourceInfo(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  SVar1 = operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffff8c8);
  JsonObjectWriter::write(local_538,(int)local_28,SVar1.m_start,SVar1.m_size);
  JsonValueWriter::writeArray(in_stack_fffffffffffff8c8);
  anon_unknown_26::writeTags(in_stack_fffffffffffff8e8._8_8_,in_stack_fffffffffffff8e8._0_8_);
  JsonArrayWriter::~JsonArrayWriter((JsonArrayWriter *)in_RDI);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a41c5);
  SVar2 = operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffff8c8);
  local_708 = (JsonReporter *)SVar2.m_start;
  JsonObjectWriter::write
            ((JsonObjectWriter *)&stack0xfffffffffffff908,(int)local_28,local_708,SVar2.m_size);
  JsonValueWriter::writeArray(in_stack_fffffffffffff8c8);
  anon_unknown_26::writeProperties(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  JsonArrayWriter::~JsonArrayWriter((JsonArrayWriter *)in_RDI);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a4240);
  JsonObjectWriter::~JsonObjectWriter((JsonObjectWriter *)in_RDI);
  operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffff8c8);
  startArray(in_stack_fffffffffffffab0,SVar1);
  return;
}

Assistant:

void JsonReporter::testCaseStarting( TestCaseInfo const& tcInfo ) {
        StreamingReporterBase::testCaseStarting( tcInfo );

        assert( isInside( Writer::Array ) &&
                "We should be in the 'test-cases' array" );
        startObject();
        // "test-info" prelude
        {
            auto testInfo =
                m_objectWriters.top().write( "test-info"_sr ).writeObject();
            // TODO: handle testName vs className!!
            testInfo.write( "name"_sr ).write( tcInfo.name );
            writeSourceInfo(testInfo, tcInfo.lineInfo);
            writeTags( testInfo.write( "tags"_sr ).writeArray(), tcInfo.tags );
            writeProperties( testInfo.write( "properties"_sr ).writeArray(),
                             tcInfo );
        }


        // Start the array for individual test runs (testCasePartial pairs)
        startArray( "runs"_sr );
    }